

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O3

void __thiscall
QPDFPageObjectHelper::externalizeInlineImages
          (QPDFPageObjectHelper *this,size_t min_size,bool shallow)

{
  _Atomic_word *p_Var1;
  bool bVar2;
  QPDF *qpdf;
  undefined7 in_register_00000011;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  QPDFObjectHandle resources;
  Pl_Buffer b;
  undefined1 local_1b8 [32];
  undefined1 local_198 [16];
  undefined1 local_188 [32];
  QPDFObjectHandle local_168 [2];
  undefined1 local_148 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  undefined1 local_118 [24];
  undefined1 local_100 [8];
  InlineImageTracker local_f8;
  Pl_Buffer local_78;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  if ((int)CONCAT71(in_register_00000011,shallow) == 0) {
    externalizeInlineImages(this,min_size,true);
    local_40._8_8_ = 0;
    local_28 = std::
               _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFPageObjectHelper.cc:436:19)>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFPageObjectHelper.cc:436:19)>
               ::_M_manager;
    local_40._M_unused._M_member_pointer = min_size;
    forEachFormXObject(this,true,
                       (function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_40);
    if (local_30 == (code *)0x0) {
      return;
    }
    (*local_30)(&local_40,&local_40,__destroy_functor);
    return;
  }
  local_f8.super_TokenFilter._vptr_TokenFilter = (_func_int **)&local_f8.qpdf;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"/Resources","");
  getAttribute((QPDFPageObjectHelper *)local_148,(string *)this,SUB81(&local_f8,0));
  if ((QPDF **)local_f8.super_TokenFilter._vptr_TokenFilter != &local_f8.qpdf) {
    operator_delete(local_f8.super_TokenFilter._vptr_TokenFilter,(ulong)((long)local_f8.qpdf + 1));
  }
  operator____qpdf(local_118 + 0x10,0x2682a3);
  QPDFObjectHandle::mergeResources
            ((QPDFObjectHandle *)local_148,(QPDFObjectHandle *)(local_118 + 0x10),
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
              *)0x0);
  if (local_100 != (undefined1  [8])0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100);
  }
  local_78.super_Pipeline._vptr_Pipeline =
       (_func_int **)
       (this->super_QPDFObjectHelper).super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78.super_Pipeline.identifier._M_dataplus._M_p =
       (pointer)(this->super_QPDFObjectHelper).super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_78.super_Pipeline.identifier._M_dataplus._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_78.super_Pipeline.identifier._M_dataplus._M_p)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_78.super_Pipeline.identifier._M_dataplus._M_p)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_78.super_Pipeline.identifier._M_dataplus._M_p)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_78.super_Pipeline.identifier._M_dataplus._M_p)->_M_use_count + 1;
    }
  }
  local_f8.qpdf = QPDFObjectHandle::getOwningQPDF((QPDFObjectHandle *)&local_78);
  if ((element_type *)local_148._8_8_ == (element_type *)0x0) {
    local_f8.resources.super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_148._8_8_ + 8) = *(_Atomic_word *)(local_148._8_8_ + 8) + 1;
      UNLOCK();
      local_f8.resources.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_;
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_148._8_8_ + 8) = *(_Atomic_word *)(local_148._8_8_ + 8) + 1;
        UNLOCK();
        goto LAB_001d55ff;
      }
    }
    else {
      *(_Atomic_word *)(local_148._8_8_ + 8) = *(_Atomic_word *)(local_148._8_8_ + 8) + 1;
    }
    local_f8.resources.super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_;
    *(_Atomic_word *)(local_148._8_8_ + 8) = *(_Atomic_word *)(local_148._8_8_ + 8) + 1;
  }
LAB_001d55ff:
  local_f8.super_TokenFilter._vptr_TokenFilter = (_func_int **)&PTR__InlineImageTracker_002eef58;
  local_f8.dict_str._M_dataplus._M_p = (pointer)&local_f8.dict_str.field_2;
  local_f8.dict_str._M_string_length = 0;
  local_f8.dict_str.field_2._M_local_buf[0] = '\0';
  local_f8.bi_str._M_dataplus._M_p = (pointer)&local_f8.bi_str.field_2;
  local_f8.bi_str._M_string_length = 0;
  local_f8.bi_str.field_2._M_local_buf[0] = '\0';
  local_f8.min_suffix = 1;
  local_f8.any_images = false;
  local_f8.state = st_top;
  local_f8.min_size = min_size;
  if ((element_type *)local_148._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_78.super_Pipeline.identifier._M_dataplus._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_78.super_Pipeline.identifier._M_dataplus._M_p);
  }
  Pl_Buffer::Pl_Buffer(&local_78,"new page content",(Pipeline *)0x0);
  filterContents(this,&local_f8.super_TokenFilter,&local_78.super_Pipeline);
  if (local_f8.any_images == true) {
    local_1b8._0_8_ =
         (this->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_1b8._8_8_ =
         (this->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_)->_M_use_count + 1;
      }
    }
    bVar2 = QPDFObjectHandle::isFormXObject((QPDFObjectHandle *)local_1b8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
    }
    if (bVar2) {
      local_1b8._0_8_ =
           (this->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_1b8._8_8_ =
           (this->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_)->_M_use_count + 1;
        }
      }
      Pl_Buffer::getBufferSharedPointer((Pl_Buffer *)local_118);
      QPDFObjectHandle::newNull();
      QPDFObjectHandle::newNull();
      QPDFObjectHandle::replaceStreamData
                ((QPDFObjectHandle *)local_1b8,(shared_ptr<Buffer> *)local_118,
                 (QPDFObjectHandle *)local_198,local_168);
      if (local_168[0].super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_168[0].super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
      }
      this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
        this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_;
      }
    }
    else {
      local_168[0].super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (this->super_QPDFObjectHelper).super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_168[0].super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (this->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_168[0].super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_168[0].super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_168[0].super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_168[0].super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_168[0].super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
        }
      }
      local_1b8._0_8_ = (element_type *)(local_1b8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"/Contents","");
      local_148._16_8_ =
           (this->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_148._24_8_ =
           (this->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((element_type *)local_148._24_8_ != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = (_Atomic_word *)
                   ((long)&(((element_type *)local_148._24_8_)->value).
                           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   + 8);
          *p_Var1 = *p_Var1 + 1;
          UNLOCK();
        }
        else {
          p_Var1 = (_Atomic_word *)
                   ((long)&(((element_type *)local_148._24_8_)->value).
                           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   + 8);
          *p_Var1 = *p_Var1 + 1;
        }
      }
      local_198._0_8_ = (element_type *)local_188;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"");
      qpdf = QPDFObjectHandle::getQPDF((QPDFObjectHandle *)(local_148 + 0x10),(string *)local_198);
      Pl_Buffer::getBufferSharedPointer((Pl_Buffer *)(local_148 + 0x20));
      QPDFObjectHandle::newStream
                ((QPDFObjectHandle *)(local_188 + 0x10),qpdf,
                 (shared_ptr<Buffer> *)(local_148 + 0x20));
      QPDFObjectHandle::replaceKey
                (local_168,(string *)local_1b8,(QPDFObjectHandle *)(local_188 + 0x10));
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._24_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._24_8_);
      }
      if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
      }
      if ((element_type *)local_198._0_8_ != (element_type *)local_188) {
        operator_delete((void *)local_198._0_8_,local_188._0_8_ + 1);
      }
      if ((element_type *)local_148._24_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._24_8_);
      }
      this_00._M_pi =
           local_168[0].super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((element_type *)local_1b8._0_8_ != (element_type *)(local_1b8 + 0x10)) {
        operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
        this_00._M_pi =
             local_168[0].super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      }
    }
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
  }
  Pl_Buffer::~Pl_Buffer(&local_78);
  anon_unknown.dwarf_653896::InlineImageTracker::~InlineImageTracker(&local_f8);
  if ((element_type *)local_148._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
  }
  return;
}

Assistant:

void
QPDFPageObjectHelper::externalizeInlineImages(size_t min_size, bool shallow)
{
    if (shallow) {
        QPDFObjectHandle resources = getAttribute("/Resources", true);
        // Calling mergeResources also ensures that /XObject becomes direct and is not shared with
        // other pages.
        resources.mergeResources("<< /XObject << >> >>"_qpdf);
        InlineImageTracker iit(oh().getOwningQPDF(), min_size, resources);
        Pl_Buffer b("new page content");
        bool filtered = false;
        try {
            filterContents(&iit, &b);
            filtered = true;
        } catch (std::exception& e) {
            oh().warnIfPossible(
                std::string("Unable to filter content stream: ") + e.what() +
                "; not attempting to externalize inline images from this stream");
        }
        if (filtered && iit.any_images) {
            if (oh().isFormXObject()) {
                oh().replaceStreamData(
                    b.getBufferSharedPointer(),
                    QPDFObjectHandle::newNull(),
                    QPDFObjectHandle::newNull());
            } else {
                oh().replaceKey(
                    "/Contents",
                    QPDFObjectHandle::newStream(&oh().getQPDF(), b.getBufferSharedPointer()));
            }
        }
    } else {
        externalizeInlineImages(min_size, true);
        forEachFormXObject(
            true, [min_size](QPDFObjectHandle& obj, QPDFObjectHandle&, std::string const&) {
                QPDFPageObjectHelper(obj).externalizeInlineImages(min_size, true);
            });
    }
}